

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void __thiscall
CVmObjLookupTable::CVmObjLookupTable(CVmObjLookupTable *this,size_t bucket_cnt,size_t val_cnt)

{
  vm_lookup_ext *pvVar1;
  CVmObjLookupTable *in_RDI;
  vm_val_t empty;
  vm_datatype_t in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffe0;
  
  CVmObjCollection::CVmObjCollection(&in_RDI->super_CVmObjCollection);
  (in_RDI->super_CVmObjCollection).super_CVmObject._vptr_CVmObject =
       (_func_int **)&PTR_get_metaclass_reg_0042ae28;
  vm_val_t::set_empty((vm_val_t *)&stack0xffffffffffffffd8);
  pvVar1 = vm_lookup_ext::alloc_ext
                     ((CVmObjLookupTable *)in_stack_ffffffffffffffe0.native_desc,
                      in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  (in_RDI->super_CVmObjCollection).super_CVmObject.ext_ = (char *)pvVar1;
  get_ext(in_RDI);
  vm_lookup_ext::init_ext((vm_lookup_ext *)in_stack_ffffffffffffffe0.native_desc);
  return;
}

Assistant:

CVmObjLookupTable::CVmObjLookupTable(VMG_ size_t bucket_cnt, size_t val_cnt)
{
    vm_val_t empty;

    /* set up an empty value */
    empty.set_empty();
    
    /* allocate our extension structure from the variable heap */
    ext_ = (char *)vm_lookup_ext::alloc_ext(vmg_ this, bucket_cnt, val_cnt);

    /* initialize the extension */
    get_ext()->init_ext();
}